

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall DataFrame::print(DataFrame *this,int rows_number)

{
  pointer pvVar1;
  pointer pbVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Printig data:\n",0xe);
  if (rows_number != 0) {
    lVar4 = 0;
    do {
      pvVar1 = (this->data).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = pvVar1[lVar4].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[lVar4].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) != pbVar2) {
        lVar5 = 8;
        uVar6 = 0;
        do {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)((long)pbVar2 + lVar5 + -8),
                              *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          uVar6 = uVar6 + 1;
          pvVar1 = (this->data).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = pvVar1[lVar4].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x20;
        } while (uVar6 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[lVar4].
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data + 8) - (long)pbVar2
                                >> 5));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 != rows_number);
  }
  return;
}

Assistant:

void DataFrame::print(int rows_number)
{

    std::cout<< "Printig data:\n";
    for (size_t i = 0; i < rows_number; i++) {
        for (size_t j = 0; j < data[i].size(); j++) {
            std::cout << data[i][j] << " ";
        }
        std::cout << std::endl;
    }

}